

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
* makePalsAsSpecified(tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                      *__return_storage_ptr__,
                     vector<ProtoPalette,_std::allocator<ProtoPalette>_> *protoPalettes)

{
  FILE *pFVar1;
  bool bVar2;
  uint16_t uVar3;
  size_type sVar4;
  array<Rgba,_4UL> *this;
  Palette *this_00;
  reference pvVar5;
  uint16_t *puVar6;
  ProtoPalette *pPVar7;
  char *pcVar8;
  value_type vVar9;
  reference pvVar10;
  reference list;
  bool local_152;
  Palette *pal_1;
  iterator __end2;
  iterator __begin2;
  vector<Palette,_std::allocator<Palette>_> *__range2;
  __normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_> local_108;
  Palette *local_100;
  Palette *local_f8;
  __normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_> local_f0;
  __normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_> local_e8;
  __normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_> iter;
  ProtoPalette *protoPal;
  size_t i_1;
  undefined1 local_c8 [6];
  bool bad;
  DefaultInitVec<size_t> mappings;
  ulong uStack_a8;
  anon_class_1_0_00000001 listColors;
  size_t i;
  Palette *pal;
  array<Rgba,_4UL> *spec;
  undefined1 local_80 [8];
  Zip<__gnu_cxx::__normal_iterator<std::array<Rgba,_4UL>_*,_std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_>,___gnu_cxx::__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>_>
  __end1;
  Zip<__gnu_cxx::__normal_iterator<std::array<Rgba,_4UL>_*,_std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_>,___gnu_cxx::__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>_>
  __begin1;
  ZipContainer<std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_&,_std::vector<Palette,_std::allocator<Palette>_>_&>
  *__range1;
  allocator<Palette> local_31;
  undefined1 local_30 [8];
  vector<Palette,_std::allocator<Palette>_> palettes;
  vector<ProtoPalette,_std::allocator<ProtoPalette>_> *protoPalettes_local;
  
  palettes.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)protoPalettes;
  sVar4 = std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::size
                    (&options.palSpec);
  std::allocator<Palette>::allocator(&local_31);
  std::vector<Palette,_std::allocator<Palette>_>::vector
            ((vector<Palette,_std::allocator<Palette>_> *)local_30,sVar4,&local_31);
  std::allocator<Palette>::~allocator(&local_31);
  zip<std::vector<std::array<Rgba,4ul>,std::allocator<std::array<Rgba,4ul>>>&,std::vector<Palette,std::allocator<Palette>>&>
            ((vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_> *)
             &__begin1._iters.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<std::array<Rgba,_4UL>_*,_std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_>,___gnu_cxx::__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<std::array<Rgba,_4UL>_*,_std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_>,_false>
             ,(vector<Palette,_std::allocator<Palette>_> *)&options.palSpec);
  detail::
  ZipContainer<std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_&,_std::vector<Palette,_std::allocator<Palette>_>_&>
  ::begin((ZipContainer<std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_&,_std::vector<Palette,_std::allocator<Palette>_>_&>
           *)&__end1._iters.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<std::array<Rgba,_4UL>_*,_std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_>,___gnu_cxx::__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<std::array<Rgba,_4UL>_*,_std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_>,_false>
         );
  detail::
  ZipContainer<std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_&,_std::vector<Palette,_std::allocator<Palette>_>_&>
  ::end((ZipContainer<std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_&,_std::vector<Palette,_std::allocator<Palette>_>_&>
         *)local_80);
  while (bVar2 = operator!=((Zip<__gnu_cxx::__normal_iterator<std::array<Rgba,_4UL>_*,_std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_>,___gnu_cxx::__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>_>
                             *)&__end1._iters.
                                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<std::array<Rgba,_4UL>_*,_std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_>,___gnu_cxx::__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>_>
                                .
                                super__Head_base<0UL,___gnu_cxx::__normal_iterator<std::array<Rgba,_4UL>_*,_std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_>,_false>
                            ,(Zip<__gnu_cxx::__normal_iterator<std::array<Rgba,_4UL>_*,_std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_>,___gnu_cxx::__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>_>
                              *)local_80), bVar2) {
    Zip<__gnu_cxx::__normal_iterator<std::array<Rgba,_4UL>_*,_std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_>,___gnu_cxx::__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>_>
    ::operator*((Zip<__gnu_cxx::__normal_iterator<std::array<Rgba,_4UL>_*,_std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_>,___gnu_cxx::__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>_>
                 *)&spec);
    this = std::get<0ul,std::array<Rgba,4ul>&,Palette&>
                     ((tuple<std::array<Rgba,_4UL>_&,_Palette_&> *)&spec);
    this_00 = std::get<1ul,std::array<Rgba,4ul>&,Palette&>
                        ((tuple<std::array<Rgba,_4UL>_&,_Palette_&> *)&spec);
    uStack_a8 = 0;
    while( true ) {
      local_152 = false;
      if (uStack_a8 < options.nbColorsPerPal) {
        pvVar5 = std::array<Rgba,_4UL>::operator[](this,uStack_a8);
        local_152 = Rgba::isOpaque(pvVar5);
      }
      if (local_152 == false) break;
      pvVar5 = std::array<Rgba,_4UL>::operator[](this,uStack_a8);
      uVar3 = Rgba::cgbColor(pvVar5);
      puVar6 = Palette::operator[](this_00,uStack_a8);
      *puVar6 = uVar3;
      uStack_a8 = uStack_a8 + 1;
    }
    Zip<__gnu_cxx::__normal_iterator<std::array<Rgba,_4UL>_*,_std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_>,___gnu_cxx::__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>_>
    ::operator++((Zip<__gnu_cxx::__normal_iterator<std::array<Rgba,_4UL>_*,_std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_>,___gnu_cxx::__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>_>
                  *)&__end1._iters.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<std::array<Rgba,_4UL>_*,_std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_>,___gnu_cxx::__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<std::array<Rgba,_4UL>_*,_std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>_>,_false>
                );
  }
  mappings.
  super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  sVar4 = std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::size
                    ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)
                     palettes.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>::default_init_allocator
            ((default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_> *)
             ((long)&i_1 + 7));
  std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::vector((vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
            *)local_c8,sVar4,
           (default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_> *)((long)&i_1 + 7)
          );
  default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>::~default_init_allocator
            ((default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_> *)
             ((long)&i_1 + 7));
  i_1._6_1_ = 0;
  protoPal = (ProtoPalette *)0x0;
  do {
    pPVar7 = (ProtoPalette *)
             std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::size
                       ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)
                        palettes.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    pFVar1 = _stderr;
    if (pPVar7 <= protoPal) {
      if ((i_1._6_1_ & 1) == 0) {
        std::
        tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
        ::
        tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>_&,_std::vector<Palette,_std::allocator<Palette>_>_&,_true>
                  (__return_storage_ptr__,
                   (vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)local_c8,(vector<Palette,_std::allocator<Palette>_> *)local_30);
        std::
        vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::~vector((vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                   *)local_c8);
        std::vector<Palette,_std::allocator<Palette>_>::~vector
                  ((vector<Palette,_std::allocator<Palette>_> *)local_30);
        return __return_storage_ptr__;
      }
      sVar4 = std::vector<Palette,_std::allocator<Palette>_>::size
                        ((vector<Palette,_std::allocator<Palette>_> *)local_30);
      pcVar8 = "s were";
      if (sVar4 == 1) {
        pcVar8 = " was";
      }
      fprintf(pFVar1,"note: The following palette%s specified:\n",pcVar8);
      __end2 = std::vector<Palette,_std::allocator<Palette>_>::begin
                         ((vector<Palette,_std::allocator<Palette>_> *)local_30);
      pal_1 = (Palette *)
              std::vector<Palette,_std::allocator<Palette>_>::end
                        ((vector<Palette,_std::allocator<Palette>_> *)local_30);
      while (bVar2 = __gnu_cxx::
                     operator==<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>
                               (&__end2,(__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>
                                         *)&pal_1), ((bVar2 ^ 0xffU) & 1) != 0) {
        list = __gnu_cxx::
               __normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>::
               operator*(&__end2);
        pFVar1 = _stderr;
        pcVar8 = makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::
                 $_1::operator()((__1 *)((long)&mappings.
                                                super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                        7),list);
        fprintf(pFVar1,"        [%s]\n",pcVar8);
        __gnu_cxx::__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>::
        operator++(&__end2);
      }
      giveUp();
    }
    iter._M_current =
         (Palette *)
         std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::operator[]
                   ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)
                    palettes.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(size_type)protoPal);
    local_f0._M_current =
         (Palette *)
         std::vector<Palette,_std::allocator<Palette>_>::begin
                   ((vector<Palette,_std::allocator<Palette>_> *)local_30);
    local_f8 = (Palette *)
               std::vector<Palette,_std::allocator<Palette>_>::end
                         ((vector<Palette,_std::allocator<Palette>_> *)local_30);
    local_100 = iter._M_current;
    local_e8 = std::
               find_if<__gnu_cxx::__normal_iterator<Palette*,std::vector<Palette,std::allocator<Palette>>>,makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                         (local_f0,(__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>
                                    )local_f8,(anon_class_8_1_acf66b11_for__M_pred)iter._M_current);
    local_108._M_current =
         (Palette *)
         std::vector<Palette,_std::allocator<Palette>_>::end
                   ((vector<Palette,_std::allocator<Palette>_> *)local_30);
    bVar2 = __gnu_cxx::operator==<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>
                      (&local_e8,&local_108);
    if (bVar2) {
      bVar2 = ProtoPalette::empty((ProtoPalette *)iter._M_current);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        __assert_fail("!protoPal.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                      ,0x260,"makePalsAsSpecified");
      }
      pcVar8 = makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::
               $_1::operator()((__1 *)((long)&mappings.
                                              super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 7
                                      ),(ProtoPalette *)iter._M_current);
      error("Could not fit tile colors [%s] in specified palettes",pcVar8);
      i_1._6_1_ = 1;
    }
    __range2 = (vector<Palette,_std::allocator<Palette>_> *)
               std::vector<Palette,_std::allocator<Palette>_>::begin
                         ((vector<Palette,_std::allocator<Palette>_> *)local_30);
    vVar9 = __gnu_cxx::operator-
                      (&local_e8,
                       (__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>
                        *)&__range2);
    pvVar10 = std::
              vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::operator[]((vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)local_c8,(size_type)protoPal);
    *pvVar10 = vVar9;
    protoPal = (ProtoPalette *)((long)(protoPal->_colorIndices)._M_elems + 1);
  } while( true );
}

Assistant:

static std::tuple<DefaultInitVec<size_t>, std::vector<Palette>>
    makePalsAsSpecified(std::vector<ProtoPalette> const &protoPalettes) {
	// Convert the palette spec to actual palettes
	std::vector<Palette> palettes(options.palSpec.size());
	for (auto [spec, pal] : zip(options.palSpec, palettes)) {
		for (size_t i = 0; i < options.nbColorsPerPal && spec[i].isOpaque(); ++i) {
			pal[i] = spec[i].cgbColor();
		}
	}

	auto listColors = [](auto const &list) {
		static char buf[sizeof(", $XXXX, $XXXX, $XXXX, $XXXX")];
		char *ptr = buf;
		for (uint16_t cgbColor : list) {
			sprintf(ptr, ", $%04x", cgbColor);
			ptr += 7;
		}
		return &buf[2];
	};

	// Iterate through proto-palettes, and try mapping them to the specified palettes
	DefaultInitVec<size_t> mappings(protoPalettes.size());
	bool bad = false;
	for (size_t i = 0; i < protoPalettes.size(); ++i) {
		ProtoPalette const &protoPal = protoPalettes[i];
		// Find the palette...
		auto iter = std::find_if(palettes.begin(), palettes.end(), [&protoPal](Palette const &pal) {
			// ...which contains all colors in this proto-pal
			return std::all_of(protoPal.begin(), protoPal.end(), [&pal](uint16_t color) {
				return std::find(pal.begin(), pal.end(), color) != pal.end();
			});
		});

		if (iter == palettes.end()) {
			assert(!protoPal.empty());
			error("Could not fit tile colors [%s] in specified palettes", listColors(protoPal));
			bad = true;
		}
		mappings[i] = iter - palettes.begin(); // Bogus value, but whatever
	}
	if (bad) {
		fprintf(stderr, "note: The following palette%s specified:\n",
		        palettes.size() == 1 ? " was" : "s were");
		for (Palette const &pal : palettes) {
			fprintf(stderr, "        [%s]\n", listColors(pal));
		}
		giveUp();
	}

	return {mappings, palettes};
}